

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O2

bool cfd::core::AdaptorUtil::Verify
               (AdaptorSignature *adaptor_sig,AdaptorProof *proof,Pubkey *adaptor,ByteData256 *msg,
               Pubkey *pubkey)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  secp256k1_pubkey secp_adaptor;
  secp256k1_pubkey secp_pubkey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_128;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  secp256k1_pubkey local_b0;
  secp256k1_pubkey local_70;
  
  ctx = wally_get_secp_context();
  ParsePubkey(&local_70,pubkey);
  ParsePubkey(&local_b0,adaptor);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)adaptor_sig);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e0,
                     (ByteData *)&local_c8);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,msg);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_128,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)proof);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_110,
                     (ByteData *)&_Stack_128);
  iVar1 = secp256k1_ecdsa_adaptor_sig_verify
                    (ctx,local_e0._M_impl.super__Vector_impl_data._M_start,&local_70,
                     local_f8._M_impl.super__Vector_impl_data._M_start,&local_b0,
                     local_110._M_impl.super__Vector_impl_data._M_start);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_110);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_128);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
  return iVar1 == 1;
}

Assistant:

bool AdaptorUtil::Verify(
    const AdaptorSignature &adaptor_sig, const AdaptorProof &proof,
    const Pubkey &adaptor, const ByteData256 &msg, const Pubkey &pubkey) {
  auto ctx = wally_get_secp_context();
  auto secp_pubkey = ParsePubkey(pubkey);
  auto secp_adaptor = ParsePubkey(adaptor);
  return secp256k1_ecdsa_adaptor_sig_verify(
             ctx, adaptor_sig.GetData().GetBytes().data(), &secp_pubkey,
             msg.GetBytes().data(), &secp_adaptor,
             proof.GetData().GetBytes().data()) == 1;
}